

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.hpp
# Opt level: O0

void __thiscall Box::draw(Box *this,mat4 *projection,mat4 *view,vec3 *eye)

{
  PFNGLDRAWELEMENTSPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORMMATRIX4FVPROC p_Var3;
  GLint GVar4;
  float *pfVar5;
  pointer pvVar6;
  socklen_t __len;
  PFNGLUNIFORM3FVPROC p_Var7;
  sockaddr *__addr;
  int __fd;
  array<unsigned_int,_36UL> local_13c;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  vec3 *local_28;
  vec3 *eye_local;
  mat4 *view_local;
  mat4 *projection_local;
  Box *this_local;
  
  local_28 = eye;
  eye_local = (vec3 *)view;
  view_local = projection;
  projection_local = (mat4 *)this;
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glEnable)(0xb44);
  (*glad_glCullFace)(0x405);
  gfx::Program::use(&this->program);
  p_Var3 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"projection",&local_49);
  GVar4 = gfx::Program::uniform_loc(&this->program,&local_48);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(view_local);
  (*p_Var3)(GVar4,1,'\0',pfVar5);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  p_Var3 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"view",&local_81);
  GVar4 = gfx::Program::uniform_loc(&this->program,&local_80);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>((mat<4,_4,_float,_(glm::qualifier)0> *)eye_local)
  ;
  (*p_Var3)(GVar4,1,'\0',pfVar5);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  p_Var2 = glad_glUniform3fv;
  p_Var7 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  __len = (socklen_t)p_Var7;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"eye",&local_a9);
  GVar4 = gfx::Program::uniform_loc(&this->program,&local_a8);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(local_28);
  __fd = 1;
  (*p_Var2)(GVar4,1,pfVar5);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  gfx::VAO::bind(&this->vao,__fd,__addr,__len);
  p_Var1 = glad_glDrawElements;
  memcpy(&local_13c,&DAT_00147f8c,0x90);
  pvVar6 = std::array<unsigned_int,_36UL>::data(&local_13c);
  (*p_Var1)(4,0x24,0x1405,pvVar6);
  gfx::VAO::unbind(&this->vao);
  (*glad_glDisable)(0xb44);
  return;
}

Assistant:

void draw(const glm::mat4& projection, const glm::mat4& view, const glm::vec3& eye) {
        glEnable(GL_BLEND);
        glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        glEnable(GL_CULL_FACE);
        glCullFace(GL_BACK);
        program.use();
        glUniformMatrix4fv(
            program.uniform_loc("projection"), 
            1,                                 // count
            GL_FALSE,                          // transpose
            glm::value_ptr(projection)         // pointer to data
        );
        glUniformMatrix4fv(program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform3fv(program.uniform_loc("eye"), 1, glm::value_ptr(eye));
        vao.bind();
        glDrawElements(GL_TRIANGLES, 36, GL_UNSIGNED_INT, std::array<uint, 36>{
            0, 3, 2, 2, 1, 0, 0, 5, 4, 4, 3, 0, 0, 1, 6, 6, 5, 0, 5, 6, 7, 7,
            4, 5, 1, 2, 7, 7, 6, 1, 3, 4, 7, 7, 2, 3
        }.data());
        vao.unbind();
        glDisable(GL_CULL_FACE);
    }